

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgqueue.c
# Opt level: O2

void nn_msgqueue_term(nn_msgqueue *self)

{
  nn_msgqueue_chunk *ptr;
  FILE *__stream;
  int iVar1;
  char *pcVar2;
  nn_msg msg;
  
  do {
    iVar1 = nn_msgqueue_recv(self,&msg);
    if (iVar1 == -0xb) {
      ptr = (self->in).chunk;
      if (ptr == (self->out).chunk) {
        nn_free(ptr);
        if (self->cache != (nn_msgqueue_chunk *)0x0) {
          nn_free(self->cache);
        }
        return;
      }
      nn_backtrace_print();
      fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","self->in.chunk == self->out.chunk",
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/inproc/msgqueue.c"
              ,0x43);
LAB_00139d07:
      fflush(_stderr);
      nn_err_abort();
    }
    if (iVar1 < 0) {
      nn_backtrace_print();
      __stream = _stderr;
      pcVar2 = nn_err_strerror(-iVar1);
      fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar2,(ulong)(uint)-iVar1,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/inproc/msgqueue.c"
              ,0x3d);
      goto LAB_00139d07;
    }
    nn_msg_term(&msg);
  } while( true );
}

Assistant:

void nn_msgqueue_term (struct nn_msgqueue *self)
{
    int rc;
    struct nn_msg msg;

    /*  Deallocate messages in the pipe. */
    while (1) {
        rc = nn_msgqueue_recv (self, &msg);
        if (rc == -EAGAIN)
            break;
        errnum_assert (rc >= 0, -rc);
        nn_msg_term (&msg);
    }

    /*  There are no more messages in the pipe so there's at most one chunk
        in the queue. Deallocate it. */
    nn_assert (self->in.chunk == self->out.chunk);
    nn_free (self->in.chunk);

    /*  Deallocate the cached chunk, if any. */
    if (self->cache)
        nn_free (self->cache);
}